

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
     ::delete_(allocator_type al,
              table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
              *arrays)

{
  allocator_type sal;
  
  if (arrays->elements_ !=
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
       *)0x0) {
    sal = al;
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>
    ::deallocate(&sal,arrays->elements_,(arrays->groups_size_mask * 0x178 + 0x186) / 0x18);
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }